

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O2

void re2c::genCondGotoSub
               (OutputFile *o,uint32_t ind,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *condnames,uint32_t cMin,uint32_t cMax)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  uint32_t n;
  string local_50;
  
  if (cMax - cMin == 0) {
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"goto ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    pOVar1 = OutputFile::wstring(pOVar1,&poVar2->condPrefix);
    pOVar1 = OutputFile::wstring(pOVar1,(condnames->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + cMin);
    OutputFile::ws(pOVar1,";\n");
    return;
  }
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"if (");
  genGetCondition_abi_cxx11_();
  pOVar1 = OutputFile::wstring(pOVar1,&local_50);
  pOVar1 = OutputFile::ws(pOVar1," < ");
  n = ((cMax - cMin) + 1 >> 1) + cMin;
  pOVar1 = OutputFile::wu32(pOVar1,n);
  OutputFile::ws(pOVar1,") {\n");
  std::__cxx11::string::~string((string *)&local_50);
  genCondGotoSub(o,ind + 1,condnames,cMin,n - 1);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"} else {\n");
  genCondGotoSub(o,ind + 1,condnames,n,cMax);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  return;
}

Assistant:

void genCondGotoSub(OutputFile & o, uint32_t ind, const std::vector<std::string> & condnames, uint32_t cMin, uint32_t cMax)
{
	if (cMin == cMax)
	{
		o.wind(ind).ws("goto ").wstring(opts->condPrefix).wstring(condnames[cMin]).ws(";\n");
	}
	else
	{
		uint32_t cMid = cMin + ((cMax - cMin + 1) / 2);

		o.wind(ind).ws("if (").wstring(genGetCondition()).ws(" < ").wu32(cMid).ws(") {\n");
		genCondGotoSub(o, ind + 1, condnames, cMin, cMid - 1);
		o.wind(ind).ws("} else {\n");
		genCondGotoSub(o, ind + 1, condnames, cMid, cMax);
		o.wind(ind).ws("}\n");
	}
}